

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void __thiscall pg::FPISolver::freezeThawReset(FPISolver *this,int i,int n,int p)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  _label_vertex _Var4;
  _label_vertex local_e0;
  bitset local_d0;
  _label_vertex local_b0;
  bitset local_a0;
  _label_vertex local_80;
  undefined1 local_70 [16];
  bitset local_60;
  _label_vertex local_40;
  undefined1 local_30 [24];
  int pl;
  int p_local;
  int n_local;
  int i_local;
  FPISolver *this_local;
  
  local_30._16_4_ = p & 1;
  local_30._20_4_ = p;
  p_local = i;
  _n_local = this;
  for (pl = n; pl != 0; pl = pl + -1) {
    bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)p_local);
    if ((!bVar1) && (this->frozen[p_local] < (int)local_30._20_4_)) {
      if (this->frozen[p_local] == 0) {
        bitset::operator[]((bitset *)(local_70 + 0x10),(size_t)&this->distraction);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)(local_70 + 0x10));
        if (bVar1) {
          bitset::operator[]((bitset *)local_70,(size_t)&this->parity);
          bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_70);
          if ((uint)bVar1 == local_30._16_4_) {
            this->frozen[p_local] = local_30._20_4_;
            if (1 < (this->super_Solver).trace) {
              poVar2 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;51;1mfreeze\x1b[m ");
              _Var4 = Solver::label_vertex(&this->super_Solver,p_local);
              local_a0._bitssize = (size_t)_Var4.g;
              local_a0._allocsize._0_4_ = _Var4.v;
              local_80.g = (Game *)local_a0._bitssize;
              local_80.v = (int)local_a0._allocsize;
              poVar2 = operator<<(poVar2,&local_80);
              poVar2 = std::operator<<(poVar2," at priority ");
              pvVar3 = (void *)std::ostream::operator<<(poVar2,local_30._20_4_);
              std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            bitset::operator[](&local_a0,(size_t)&this->distraction);
            bitset::reference::operator=((reference *)&local_a0,false);
            if (1 < (this->super_Solver).trace) {
              poVar2 = std::operator<<((this->super_Solver).logger,"\x1b[31;1mresetting\x1b[m ");
              _Var4 = Solver::label_vertex(&this->super_Solver,p_local);
              local_d0._bitssize = (size_t)_Var4.g;
              local_d0._allocsize._0_4_ = _Var4.v;
              local_b0.g = (Game *)local_d0._bitssize;
              local_b0.v = (int)local_d0._allocsize;
              poVar2 = operator<<(poVar2,&local_b0);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            }
          }
        }
        else {
          bitset::operator[](&local_d0,(size_t)&this->parity);
          bVar1 = bitset::reference::operator_cast_to_bool((reference *)&local_d0);
          if (((uint)bVar1 != local_30._16_4_) &&
             (this->frozen[p_local] = local_30._20_4_, 1 < (this->super_Solver).trace)) {
            poVar2 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;51;1mfreeze\x1b[m ");
            _Var4 = Solver::label_vertex(&this->super_Solver,p_local);
            local_e0.g = _Var4.g;
            local_e0.v = _Var4.v;
            poVar2 = operator<<(poVar2,&local_e0);
            poVar2 = std::operator<<(poVar2," at priority ");
            pvVar3 = (void *)std::ostream::operator<<(poVar2,local_30._20_4_);
            std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      else if ((this->frozen[p_local] & 1U) == local_30._16_4_) {
        this->frozen[p_local] = local_30._20_4_;
      }
      else {
        this->frozen[p_local] = 0;
        bitset::operator[]((bitset *)local_30,(size_t)&this->distraction);
        bitset::reference::operator=((reference *)local_30,false);
        if (1 < (this->super_Solver).trace) {
          poVar2 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;202;1mthaw\x1b[m ");
          _Var4 = Solver::label_vertex(&this->super_Solver,p_local);
          local_60._bitssize = (size_t)_Var4.g;
          local_60._allocsize._0_4_ = _Var4.v;
          local_40.g = (Game *)local_60._bitssize;
          local_40.v = (int)local_60._allocsize;
          poVar2 = operator<<(poVar2,&local_40);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    p_local = p_local + 1;
  }
  return;
}

Assistant:

void
FPISolver::freezeThawReset(int i, int n, int p)
{
    const int pl = p&1;
    for (; n != 0; i++, n--) {
        if (disabled[i]) continue; // not in the subgame
        if (frozen[i] >= p) continue; // already frozen

        if (frozen[i]) {
            if ((frozen[i]&1) == pl) {
                frozen[i] = p;
            } else {
                frozen[i] = 0;
                distraction[i] = 0;
#ifndef NDEBUG
                if (trace >= 2) logger << "\033[38;5;202;1mthaw\033[m " << label_vertex(i) << std::endl;
#endif
            }
        } else if (distraction[i]) {
            if (parity[i] == pl) {
                frozen[i] = p;
#ifndef NDEBUG
                if (trace >= 2) logger << "\033[38;5;51;1mfreeze\033[m " << label_vertex(i) << " at priority " << p << std::endl;
#endif
            } else {
                distraction[i] = 0;
#ifndef NDEBUG
                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(i) << std::endl;
#endif
            }
        } else if (parity[i] != pl) {
            frozen[i] = p;
#ifndef NDEBUG
            if (trace >= 2) logger << "\033[38;5;51;1mfreeze\033[m " << label_vertex(i) << " at priority " << p << std::endl;
#endif
        }
    }
}